

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void JS_ComputeMemoryUsage(JSRuntime *rt,JSMemoryUsage *s)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  list_head *plVar4;
  list_head *plVar5;
  long lVar6;
  JSShape **ppJVar7;
  JSAtomStruct **ppJVar8;
  size_t sVar9;
  int64_t iVar10;
  int64_t iVar11;
  int64_t iVar12;
  int64_t iVar13;
  byte bVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  JSShape *pJVar20;
  list_head *plVar21;
  JSString *str;
  int iVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  long local_e0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_98;
  JSMemoryUsage_helper local_88;
  long local_48;
  long local_40;
  long local_38;
  
  local_88.js_func_pc2line_count = 0;
  local_88.js_func_pc2line_size = 0;
  local_88.js_func_size = 0.0;
  local_88.js_func_code_size = 0;
  local_88.str_size = 0.0;
  local_88.js_func_count = 0;
  local_88.memory_used_count = 0.0;
  local_88.str_count = 0.0;
  memset(s,0,0xd0);
  s->malloc_count = (rt->malloc_state).malloc_count;
  sVar9 = (rt->malloc_state).malloc_limit;
  s->malloc_size = (rt->malloc_state).malloc_size;
  s->malloc_limit = sVar9;
  s->memory_used_count = 2;
  lVar15 = (long)rt->class_count * 0x10;
  lVar24 = lVar15 + 400;
  s->memory_used_size = lVar24;
  plVar21 = (rt->context_list).next;
  if (plVar21 == &rt->context_list) {
    local_c0 = 0;
    local_e0 = 2;
    local_c8 = 0;
  }
  else {
    local_e0 = 2;
    local_c0 = 0;
    local_c8 = 0;
    lVar16 = 0;
    lVar19 = 0;
    do {
      lVar24 = lVar24 + lVar15 + 0x1c0;
      plVar4 = plVar21[1].next;
      s->memory_used_count = local_e0 + 2;
      s->memory_used_size = lVar24;
      lVar19 = (ulong)*(ushort *)&plVar21[1].prev + lVar19;
      s->binary_object_count = lVar19;
      lVar16 = *(int *)((long)&plVar21[1].prev + 4) + lVar16;
      s->binary_object_size = lVar16;
      if ((plVar4 != (list_head *)0x0) && (*(char *)&plVar4[1].next == '\0')) {
        iVar22 = *(int *)&plVar4[2].prev;
        local_c8 = local_c8 + 1;
        s->shape_count = local_c8;
        local_c0 = local_c0 + (long)(iVar22 + 1) * 4 + (long)*(int *)((long)&plVar4[2].prev + 4) * 8
                   + 0x40;
        s->shape_size = local_c0;
      }
      local_e0 = local_e0 + 2;
      for (plVar4 = plVar21[0x18].prev; plVar4 != (list_head *)&plVar21[0x17].next;
          plVar4 = plVar4->next) {
        lVar17 = local_e0 + 1;
        s->memory_used_count = lVar17;
        lVar24 = lVar24 + 0xa8;
        s->memory_used_size = lVar24;
        if (plVar4[1].prev != (list_head *)0x0) {
          lVar17 = local_e0 + 2;
          s->memory_used_count = lVar17;
          lVar24 = lVar24 + (long)*(int *)&plVar4[1].next * 0x10;
          s->memory_used_size = lVar24;
        }
        plVar5 = plVar4[2].prev;
        if (plVar5 != (list_head *)0x0) {
          lVar17 = lVar17 + 1;
          s->memory_used_count = lVar17;
          iVar22 = *(int *)&plVar4[2].next;
          lVar23 = (long)iVar22 * 0x20;
          lVar24 = lVar24 + lVar23;
          s->memory_used_size = lVar24;
          if (0 < (long)iVar22) {
            lVar18 = 0;
            do {
              if ((*(int *)((long)&plVar5[1].prev + lVar18) == 0) &&
                 (*(long *)((long)&plVar5->next + lVar18) != 0)) {
                lVar17 = lVar17 + 1;
                s->memory_used_count = lVar17;
                lVar6 = *(long *)((long)&plVar5->next + lVar18);
                if (*(int *)(lVar6 + 0x28) == -7) {
                  compute_jsstring_size(*(JSString **)(lVar6 + 0x20),&local_88);
                }
              }
              lVar18 = lVar18 + 0x20;
            } while (lVar23 != lVar18);
          }
        }
        if (plVar4[3].prev != (list_head *)0x0) {
          lVar17 = lVar17 + 1;
          s->memory_used_count = lVar17;
          lVar24 = lVar24 + (long)*(int *)&plVar4[3].next * 4;
          s->memory_used_size = lVar24;
        }
        if (plVar4[4].prev != (list_head *)0x0) {
          lVar17 = lVar17 + 1;
          s->memory_used_count = lVar17;
          lVar24 = lVar24 + (long)*(int *)&plVar4[4].next * 0xc;
          s->memory_used_size = lVar24;
        }
        if (*(int *)&plVar4[5].next == -7) {
          compute_jsstring_size((JSString *)plVar4[5].prev,&local_88);
        }
        if (*(int *)&plVar4[6].next == -7) {
          compute_jsstring_size((JSString *)plVar4[6].prev,&local_88);
        }
        local_e0 = lVar17;
      }
      plVar21 = plVar21->next;
    } while (plVar21 != &rt->context_list);
  }
  plVar21 = (rt->gc_obj_list).next;
  if (plVar21 == &rt->gc_obj_list) {
    local_a8 = 0;
    lVar15 = 0;
  }
  else {
    local_48 = 0;
    local_38 = 0;
    local_98 = 0;
    local_40 = 0;
    local_b8 = 0;
    local_b0 = 0;
    local_a8 = 0;
    lVar15 = 0;
    do {
      if (((ulong)plVar21[-1].next & 0xf00000000) == 0) {
        plVar4 = plVar21[1].prev;
        lVar15 = lVar15 + 1;
        s->obj_count = lVar15;
        plVar5 = plVar21[1].next;
        if (plVar5 != (list_head *)0x0) {
          local_e0 = local_e0 + 1;
          s->memory_used_count = local_e0;
          local_a8 = local_a8 + (long)*(int *)((long)&plVar4[2].prev + 4) * 0x10;
          s->prop_size = local_a8;
          lVar19 = (long)*(int *)&plVar4[2].next;
          local_b0 = local_b0 + lVar19;
          s->prop_count = local_b0;
          if (0 < lVar19) {
            lVar16 = 0;
            do {
              if (((*(int *)((long)&plVar4[4].prev + lVar16 + 4) != 0) &&
                  (*(uint *)((long)&plVar4[4].prev + lVar16) < 0x40000000)) &&
                 (*(int *)((long)&plVar5->next + lVar16 * 2) == -7)) {
                compute_jsstring_size(*(JSString **)((long)&plVar5->prev + lVar16 * 2),&local_88);
              }
              lVar16 = lVar16 + 8;
            } while (lVar19 * 8 != lVar16);
          }
        }
        if (*(char *)&plVar4[1].next == '\0') {
          iVar22 = *(int *)&plVar4[2].prev;
          local_c8 = local_c8 + 1;
          s->shape_count = local_c8;
          local_c0 = local_c0 + (long)(iVar22 + 1) * 4 +
                     (long)*(int *)((long)&plVar4[2].prev + 4) * 8 + 0x40;
          s->shape_size = local_c0;
        }
        lVar19 = local_e0;
        switch(*(undefined2 *)((long)&plVar21[-1].next + 6)) {
        case 2:
        case 8:
          local_98 = local_98 + 1;
          s->array_count = local_98;
          if (((ulong)plVar21[-1].next & 0x80000000000) != 0) {
            local_38 = local_38 + 1;
            s->fast_array_count = local_38;
            if (plVar21[3].prev != (list_head *)0x0) {
              lVar19 = local_e0 + 1;
              s->memory_used_count = lVar19;
              lVar24 = lVar24 + (ulong)*(uint *)&plVar21[3].next * 0x10;
              s->memory_used_size = lVar24;
              local_48 = local_48 + (ulong)*(uint *)&plVar21[3].next;
              s->fast_array_elements = local_48;
              uVar3 = *(uint *)&plVar21[3].next;
              if ((ulong)uVar3 != 0) {
                plVar4 = plVar21[3].prev;
                lVar16 = 0;
                do {
                  if (*(int *)((long)&plVar4->next + lVar16) == -7) {
                    compute_jsstring_size(*(JSString **)((long)&plVar4->prev + lVar16),&local_88);
                  }
                  lVar16 = lVar16 + 0x10;
                } while ((ulong)uVar3 << 4 != lVar16);
              }
            }
          }
          break;
        default:
          if (plVar21[2].next != (list_head *)0x0) {
            s->memory_used_count = local_e0 + 1;
            lVar19 = local_e0 + 1;
          }
          break;
        case 4:
        case 5:
        case 6:
        case 7:
        case 10:
          if (*(int *)&plVar21[3].prev == -7) {
            str = (JSString *)plVar21[2].next;
            goto LAB_0011adfa;
          }
          break;
        case 0xc:
          local_40 = local_40 + 1;
          s->c_func_count = local_40;
          break;
        case 0xd:
          plVar4 = plVar21[3].prev;
          if (plVar4 != (list_head *)0x0) {
            plVar5 = plVar21[2].next;
            local_e0 = local_e0 + 1;
            s->memory_used_count = local_e0;
            lVar16 = (long)*(int *)((long)&plVar5[5].next + 4);
            local_b8 = local_b8 + lVar16 * 8;
            s->js_func_size = local_b8;
            lVar19 = local_e0;
            if (0 < lVar16) {
              lVar17 = 0;
              do {
                plVar5 = (&plVar4->prev)[lVar17];
                if (plVar5 != (list_head *)0x0) {
                  iVar22 = *(int *)&plVar5->prev;
                  local_e0 = (long)((double)local_e0 + 1.0 / (double)iVar22);
                  s->memory_used_count = local_e0;
                  local_b8 = (long)((double)local_b8 + 48.0 / (double)iVar22);
                  s->js_func_size = local_b8;
                  if ((plVar5[1].next == plVar5 + 2) && (*(int *)&plVar5[2].next == -7)) {
                    compute_jsstring_size((JSString *)plVar5[2].prev,&local_88);
                  }
                }
                lVar17 = lVar17 + 1;
                lVar19 = local_e0;
              } while (lVar16 != lVar17);
            }
          }
          break;
        case 0xe:
          plVar4 = plVar21[2].next;
          lVar19 = (long)*(int *)&plVar4[2].prev;
          if (0 < lVar19) {
            lVar16 = 0;
            do {
              if (*(int *)((long)&plVar4[3].prev + lVar16) == -7) {
                compute_jsstring_size(*(JSString **)((long)&plVar4[2].next + lVar16),&local_88);
              }
              lVar16 = lVar16 + 0x10;
            } while (lVar19 << 4 != lVar16);
          }
          s->memory_used_count = local_e0 + 1;
          lVar24 = lVar24 + lVar19 * 0x10 + 0x28;
LAB_0011b04a:
          local_e0 = local_e0 + 1;
          s->memory_used_size = lVar24;
          lVar19 = local_e0;
          break;
        case 0xf:
          plVar4 = plVar21[2].next;
          if (plVar4 != (list_head *)0x0) {
            bVar14 = *(byte *)((long)&plVar4->next + 1);
            if (bVar14 != 0) {
              lVar19 = 0;
              do {
                if (*(int *)((long)&plVar4[1].next + lVar19) == -7) {
                  compute_jsstring_size(*(JSString **)((long)&plVar4[1].prev + lVar19),&local_88);
                }
                lVar19 = lVar19 + 0x10;
              } while ((ulong)bVar14 * 0x10 != lVar19);
            }
            s->memory_used_count = local_e0 + 1;
            lVar24 = lVar24 + (ulong)bVar14 * 0x10 + 0x10;
            goto LAB_0011b04a;
          }
          break;
        case 0x11:
          plVar4 = plVar21[2].next;
          if (plVar4 != (list_head *)0x0) {
            if (*(int *)&plVar4->next == -7) {
              compute_jsstring_size((JSString *)plVar4->prev,&local_88);
            }
            local_e0 = local_e0 + 1;
            s->memory_used_count = local_e0;
            lVar24 = lVar24 + 0x20;
LAB_0011ae47:
            s->memory_used_size = lVar24;
            lVar19 = local_e0;
          }
          break;
        case 0x12:
          compute_jsstring_size((JSString *)plVar21[2].next,&local_88);
          str = (JSString *)plVar21[3].prev;
LAB_0011adfa:
          compute_jsstring_size(str,&local_88);
          break;
        case 0x13:
        case 0x14:
          plVar4 = plVar21[2].next;
          if (plVar4 != (list_head *)0x0) {
            s->memory_used_count = local_e0 + 1;
            lVar24 = lVar24 + 0x30;
            s->memory_used_size = lVar24;
            lVar19 = local_e0 + 1;
            if (plVar4->next != (list_head *)0x0) {
              local_e0 = local_e0 + 2;
              s->memory_used_count = local_e0;
              lVar24 = lVar24 + *(int *)&plVar4->prev;
              goto LAB_0011ae47;
            }
          }
        }
      }
      else {
        lVar19 = local_e0;
        if (((ulong)plVar21[-1].next & 0xf00000000) == 0x100000000) {
          if (plVar21[2].next == (list_head *)0x0) {
            iVar22 = 0x60;
          }
          else {
            iVar22 = ((uint)*(ushort *)((long)&plVar21[3].next + 2) +
                     (uint)*(ushort *)&plVar21[3].next) * 0x10 + 0x60;
          }
          plVar4 = plVar21[4].next;
          if (plVar4 != (list_head *)0x0) {
            iVar2 = *(int *)&plVar21[5].prev;
            iVar22 = iVar22 + iVar2 * 0x10;
            if (0 < (long)iVar2) {
              lVar16 = 0;
              do {
                if (*(int *)((long)&plVar4->next + lVar16) == -7) {
                  compute_jsstring_size(*(JSString **)((long)&plVar4->prev + lVar16),&local_88);
                }
                lVar16 = lVar16 + 0x10;
              } while ((long)iVar2 * 0x10 != lVar16);
            }
          }
          if (plVar21[3].prev != (list_head *)0x0) {
            iVar22 = iVar22 + *(int *)((long)&plVar21[5].prev + 4) * 8;
          }
          uVar1 = *(ushort *)((long)&plVar21[1].prev + 1);
          if (((uVar1 >> 0xc & 1) == 0) && (plVar21[1].next != (list_head *)0x0)) {
            local_88.js_func_code_size = local_88.js_func_code_size + *(int *)&plVar21[2].prev;
          }
          bVar14 = 0;
          if ((uVar1 >> 10 & 1) != 0) {
            bVar25 = plVar21[7].prev == (list_head *)0x0;
            if (bVar25) {
              iVar22 = iVar22 + 0x20;
            }
            else {
              iVar22 = iVar22 + *(int *)&plVar21[6].prev + 0x21;
            }
            bVar14 = !bVar25;
            lVar16 = (long)*(int *)((long)&plVar21[6].prev + 4);
            if (lVar16 != 0) {
              bVar14 = bVar14 + 1;
              local_88.js_func_pc2line_count = local_88.js_func_pc2line_count + 1;
              local_88.js_func_pc2line_size = lVar16 + local_88.js_func_pc2line_size;
            }
          }
          local_88.js_func_size = (double)iVar22 + local_88.js_func_size;
          local_88.js_func_count = local_88.js_func_count + 1;
          local_88.memory_used_count = (double)bVar14 + local_88.memory_used_count;
        }
      }
      local_e0 = lVar19;
      plVar21 = plVar21->next;
    } while (plVar21 != &rt->gc_obj_list);
  }
  s->obj_size = lVar15 * 0x48;
  lVar19 = (long)rt->shape_hash_size;
  lVar24 = lVar24 + lVar19 * 8;
  s->memory_used_size = lVar24;
  if (0 < lVar19) {
    ppJVar7 = rt->shape_hash;
    lVar16 = 0;
    do {
      pJVar20 = ppJVar7[lVar16];
      if (pJVar20 != (JSShape *)0x0) {
        do {
          local_c8 = local_c8 + 1;
          local_c0 = local_c0 + (long)(int)(pJVar20->prop_hash_mask + 1) * 4 +
                     (long)pJVar20->prop_size * 8 + 0x40;
          pJVar20 = pJVar20->shape_hash_next;
        } while (pJVar20 != (JSShape *)0x0);
        s->shape_count = local_c8;
        s->shape_size = local_c0;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar19);
  }
  s->memory_used_count = local_e0 + 3;
  iVar22 = rt->atom_count;
  s->atom_count = (long)iVar22;
  lVar16 = (long)rt->atom_size;
  lVar19 = lVar16 * 8 + (long)rt->atom_hash_size * 4;
  s->atom_size = lVar19;
  if (0 < lVar16) {
    ppJVar8 = rt->atom_array;
    lVar17 = 0;
    do {
      if (((ulong)ppJVar8[lVar17] & 1) == 0) {
        uVar3 = *(uint *)&ppJVar8[lVar17]->field_0x4;
        lVar19 = (lVar19 - (ulong)((int)uVar3 < 0)) +
                 (long)(int)((uVar3 & 0x7fffffff) << (byte)(uVar3 >> 0x1f)) + 0x11;
        s->atom_size = lVar19;
      }
      lVar17 = lVar17 + 1;
    } while (lVar16 != lVar17);
  }
  dVar26 = round(local_88.str_count);
  s->str_count = (long)dVar26;
  dVar27 = round(local_88.str_size);
  iVar10 = local_88.js_func_count;
  s->str_size = (long)dVar27;
  s->js_func_count = local_88.js_func_count;
  dVar28 = round(local_88.js_func_size);
  iVar13 = local_88.js_func_pc2line_size;
  iVar12 = local_88.js_func_pc2line_count;
  iVar11 = local_88.js_func_code_size;
  s->js_func_size = (long)dVar28;
  s->js_func_code_size = local_88.js_func_code_size;
  s->js_func_pc2line_count = local_88.js_func_pc2line_count;
  s->js_func_pc2line_size = local_88.js_func_pc2line_size;
  dVar29 = round(local_88.memory_used_count);
  s->memory_used_count =
       (long)((double)(local_e0 + 3) +
             (double)iVar12 +
             (double)iVar10 +
             (double)local_c8 + (double)lVar15 + (double)(long)dVar26 + (double)iVar22 + dVar29);
  s->memory_used_size =
       lVar19 + iVar13 + local_a8 + local_c0 +
       (long)dVar28 + iVar11 + lVar24 + lVar15 * 0x48 + (long)dVar27;
  return;
}

Assistant:

void JS_ComputeMemoryUsage(JSRuntime *rt, JSMemoryUsage *s)
{
    struct list_head *el, *el1;
    int i;
    JSMemoryUsage_helper mem = { 0 }, *hp = &mem;

    memset(s, 0, sizeof(*s));
    s->malloc_count = rt->malloc_state.malloc_count;
    s->malloc_size = rt->malloc_state.malloc_size;
    s->malloc_limit = rt->malloc_state.malloc_limit;

    s->memory_used_count = 2; /* rt + rt->class_array */
    s->memory_used_size = sizeof(JSRuntime) + sizeof(JSValue) * rt->class_count;

    list_for_each(el, &rt->context_list) {
        JSContext *ctx = list_entry(el, JSContext, link);
        JSShape *sh = ctx->array_shape;
        s->memory_used_count += 2; /* ctx + ctx->class_proto */
        s->memory_used_size += sizeof(JSContext) +
            sizeof(JSValue) * rt->class_count;
        s->binary_object_count += ctx->binary_object_count;
        s->binary_object_size += ctx->binary_object_size;

        /* the hashed shapes are counted separately */
        if (sh && !sh->is_hashed) {
            int hash_size = sh->prop_hash_mask + 1;
            s->shape_count++;
            s->shape_size += get_shape_size(hash_size, sh->prop_size);
        }
        list_for_each(el1, &ctx->loaded_modules) {
            JSModuleDef *m = list_entry(el1, JSModuleDef, link);
            s->memory_used_count += 1;
            s->memory_used_size += sizeof(*m);
            if (m->req_module_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->req_module_entries_count * sizeof(*m->req_module_entries);
            }
            if (m->export_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->export_entries_count * sizeof(*m->export_entries);
                for (i = 0; i < m->export_entries_count; i++) {
                    JSExportEntry *me = &m->export_entries[i];
                    if (me->export_type == JS_EXPORT_TYPE_LOCAL && me->u.local.var_ref) {
                        /* potential multiple count */
                        s->memory_used_count += 1;
                        compute_value_size(me->u.local.var_ref->value, hp);
                    }
                }
            }
            if (m->star_export_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->star_export_entries_count * sizeof(*m->star_export_entries);
            }
            if (m->import_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->import_entries_count * sizeof(*m->import_entries);
            }
            compute_value_size(m->module_ns, hp);
            compute_value_size(m->func_obj, hp);
        }
    }

    list_for_each(el, &rt->gc_obj_list) {
        JSGCObjectHeader *gp = list_entry(el, JSGCObjectHeader, link);
        JSObject *p;
        JSShape *sh;
        JSShapeProperty *prs;

        /* XXX: could count the other GC object types too */
        if (gp->gc_obj_type == JS_GC_OBJ_TYPE_FUNCTION_BYTECODE) {
            compute_bytecode_size((JSFunctionBytecode *)gp, hp);
            continue;
        } else if (gp->gc_obj_type != JS_GC_OBJ_TYPE_JS_OBJECT) {
            continue;
        }
        p = (JSObject *)gp;
        sh = p->shape;
        s->obj_count++;
        if (p->prop) {
            s->memory_used_count++;
            s->prop_size += sh->prop_size * sizeof(*p->prop);
            s->prop_count += sh->prop_count;
            prs = get_shape_prop(sh);
            for(i = 0; i < sh->prop_count; i++) {
                JSProperty *pr = &p->prop[i];
                if (prs->atom != JS_ATOM_NULL && !(prs->flags & JS_PROP_TMASK)) {
                    compute_value_size(pr->u.value, hp);
                }
                prs++;
            }
        }
        /* the hashed shapes are counted separately */
        if (!sh->is_hashed) {
            int hash_size = sh->prop_hash_mask + 1;
            s->shape_count++;
            s->shape_size += get_shape_size(hash_size, sh->prop_size);
        }

        switch(p->class_id) {
        case JS_CLASS_ARRAY:             /* u.array | length */
        case JS_CLASS_ARGUMENTS:         /* u.array | length */
            s->array_count++;
            if (p->fast_array) {
                s->fast_array_count++;
                if (p->u.array.u.values) {
                    s->memory_used_count++;
                    s->memory_used_size += p->u.array.count *
                        sizeof(*p->u.array.u.values);
                    s->fast_array_elements += p->u.array.count;
                    for (i = 0; i < p->u.array.count; i++) {
                        compute_value_size(p->u.array.u.values[i], hp);
                    }
                }
            }
            break;
        case JS_CLASS_NUMBER:            /* u.object_data */
        case JS_CLASS_STRING:            /* u.object_data */
        case JS_CLASS_BOOLEAN:           /* u.object_data */
        case JS_CLASS_SYMBOL:            /* u.object_data */
        case JS_CLASS_DATE:              /* u.object_data */
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT:           /* u.object_data */
        case JS_CLASS_BIG_FLOAT:         /* u.object_data */
        case JS_CLASS_BIG_DECIMAL:         /* u.object_data */
#endif
            compute_value_size(p->u.object_data, hp);
            break;
        case JS_CLASS_C_FUNCTION:        /* u.cfunc */
            s->c_func_count++;
            break;
        case JS_CLASS_BYTECODE_FUNCTION: /* u.func */
            {
                JSFunctionBytecode *b = p->u.func.function_bytecode;
                JSVarRef **var_refs = p->u.func.var_refs;
                /* home_object: object will be accounted for in list scan */
                if (var_refs) {
                    s->memory_used_count++;
                    s->js_func_size += b->closure_var_count * sizeof(*var_refs);
                    for (i = 0; i < b->closure_var_count; i++) {
                        if (var_refs[i]) {
                            double ref_count = var_refs[i]->header.ref_count;
                            s->memory_used_count += 1 / ref_count;
                            s->js_func_size += sizeof(*var_refs[i]) / ref_count;
                            /* handle non object closed values */
                            if (var_refs[i]->pvalue == &var_refs[i]->value) {
                                /* potential multiple count */
                                compute_value_size(var_refs[i]->value, hp);
                            }
                        }
                    }
                }
            }
            break;
        case JS_CLASS_BOUND_FUNCTION:    /* u.bound_function */
            {
                JSBoundFunction *bf = p->u.bound_function;
                /* func_obj and this_val are objects */
                for (i = 0; i < bf->argc; i++) {
                    compute_value_size(bf->argv[i], hp);
                }
                s->memory_used_count += 1;
                s->memory_used_size += sizeof(*bf) + bf->argc * sizeof(*bf->argv);
            }
            break;
        case JS_CLASS_C_FUNCTION_DATA:   /* u.c_function_data_record */
            {
                JSCFunctionDataRecord *fd = p->u.c_function_data_record;
                if (fd) {
                    for (i = 0; i < fd->data_len; i++) {
                        compute_value_size(fd->data[i], hp);
                    }
                    s->memory_used_count += 1;
                    s->memory_used_size += sizeof(*fd) + fd->data_len * sizeof(*fd->data);
                }
            }
            break;
        case JS_CLASS_REGEXP:            /* u.regexp */
            compute_jsstring_size(p->u.regexp.pattern, hp);
            compute_jsstring_size(p->u.regexp.bytecode, hp);
            break;

        case JS_CLASS_FOR_IN_ITERATOR:   /* u.for_in_iterator */
            {
                JSForInIterator *it = p->u.for_in_iterator;
                if (it) {
                    compute_value_size(it->obj, hp);
                    s->memory_used_count += 1;
                    s->memory_used_size += sizeof(*it);
                }
            }
            break;
        case JS_CLASS_ARRAY_BUFFER:      /* u.array_buffer */
        case JS_CLASS_SHARED_ARRAY_BUFFER: /* u.array_buffer */
            {
                JSArrayBuffer *abuf = p->u.array_buffer;
                if (abuf) {
                    s->memory_used_count += 1;
                    s->memory_used_size += sizeof(*abuf);
                    if (abuf->data) {
                        s->memory_used_count += 1;
                        s->memory_used_size += abuf->byte_length;
                    }
                }
            }
            break;
        case JS_CLASS_GENERATOR:         /* u.generator_data */
        case JS_CLASS_UINT8C_ARRAY:      /* u.typed_array / u.array */
        case JS_CLASS_INT8_ARRAY:        /* u.typed_array / u.array */
        case JS_CLASS_UINT8_ARRAY:       /* u.typed_array / u.array */
        case JS_CLASS_INT16_ARRAY:       /* u.typed_array / u.array */
        case JS_CLASS_UINT16_ARRAY:      /* u.typed_array / u.array */
        case JS_CLASS_INT32_ARRAY:       /* u.typed_array / u.array */
        case JS_CLASS_UINT32_ARRAY:      /* u.typed_array / u.array */
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT64_ARRAY:   /* u.typed_array / u.array */
        case JS_CLASS_BIG_UINT64_ARRAY:  /* u.typed_array / u.array */
#endif
        case JS_CLASS_FLOAT32_ARRAY:     /* u.typed_array / u.array */
        case JS_CLASS_FLOAT64_ARRAY:     /* u.typed_array / u.array */
        case JS_CLASS_DATAVIEW:          /* u.typed_array */
#ifdef CONFIG_BIGNUM
        case JS_CLASS_FLOAT_ENV:         /* u.float_env */
#endif
        case JS_CLASS_MAP:               /* u.map_state */
        case JS_CLASS_SET:               /* u.map_state */
        case JS_CLASS_WEAKMAP:           /* u.map_state */
        case JS_CLASS_WEAKSET:           /* u.map_state */
        case JS_CLASS_MAP_ITERATOR:      /* u.map_iterator_data */
        case JS_CLASS_SET_ITERATOR:      /* u.map_iterator_data */
        case JS_CLASS_ARRAY_ITERATOR:    /* u.array_iterator_data */
        case JS_CLASS_STRING_ITERATOR:   /* u.array_iterator_data */
        case JS_CLASS_PROXY:             /* u.proxy_data */
        case JS_CLASS_PROMISE:           /* u.promise_data */
        case JS_CLASS_PROMISE_RESOLVE_FUNCTION:  /* u.promise_function_data */
        case JS_CLASS_PROMISE_REJECT_FUNCTION:   /* u.promise_function_data */
        case JS_CLASS_ASYNC_FUNCTION_RESOLVE:    /* u.async_function_data */
        case JS_CLASS_ASYNC_FUNCTION_REJECT:     /* u.async_function_data */
        case JS_CLASS_ASYNC_FROM_SYNC_ITERATOR:  /* u.async_from_sync_iterator_data */
        case JS_CLASS_ASYNC_GENERATOR:   /* u.async_generator_data */
            /* TODO */
        default:
            /* XXX: class definition should have an opaque block size */
            if (p->u.opaque) {
                s->memory_used_count += 1;
            }
            break;
        }
    }
    s->obj_size += s->obj_count * sizeof(JSObject);

    /* hashed shapes */
    s->memory_used_count++; /* rt->shape_hash */
    s->memory_used_size += sizeof(rt->shape_hash[0]) * rt->shape_hash_size;
    for(i = 0; i < rt->shape_hash_size; i++) {
        JSShape *sh;
        for(sh = rt->shape_hash[i]; sh != NULL; sh = sh->shape_hash_next) {
            int hash_size = sh->prop_hash_mask + 1;
            s->shape_count++;
            s->shape_size += get_shape_size(hash_size, sh->prop_size);
        }
    }

    /* atoms */
    s->memory_used_count += 2; /* rt->atom_array, rt->atom_hash */
    s->atom_count = rt->atom_count;
    s->atom_size = sizeof(rt->atom_array[0]) * rt->atom_size +
        sizeof(rt->atom_hash[0]) * rt->atom_hash_size;
    for(i = 0; i < rt->atom_size; i++) {
        JSAtomStruct *p = rt->atom_array[i];
        if (!atom_is_free(p)) {
            s->atom_size += (sizeof(*p) + (p->len << p->is_wide_char) +
                             1 - p->is_wide_char);
        }
    }
    s->str_count = round(mem.str_count);
    s->str_size = round(mem.str_size);
    s->js_func_count = mem.js_func_count;
    s->js_func_size = round(mem.js_func_size);
    s->js_func_code_size = mem.js_func_code_size;
    s->js_func_pc2line_count = mem.js_func_pc2line_count;
    s->js_func_pc2line_size = mem.js_func_pc2line_size;
    s->memory_used_count += round(mem.memory_used_count) +
        s->atom_count + s->str_count +
        s->obj_count + s->shape_count +
        s->js_func_count + s->js_func_pc2line_count;
    s->memory_used_size += s->atom_size + s->str_size +
        s->obj_size + s->prop_size + s->shape_size +
        s->js_func_size + s->js_func_code_size + s->js_func_pc2line_size;
}